

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerMemOp(Lowerer *this,Instr *instr)

{
  undefined2 uVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  BailOutKind BVar4;
  BailOutKind BVar5;
  undefined4 *puVar6;
  RegOpnd *helperRet;
  LabelInstr *target;
  IntConstOpnd *compareSrc2;
  Instr *pIVar7;
  char *message;
  char *error;
  uint uVar8;
  Lowerer *this_00;
  Instr *pIVar9;
  
  uVar1 = instr->m_opcode;
  if (1 < (ushort)(uVar1 - 0x203)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x25e7,
                       "(instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar3) goto LAB_005ac70b;
    *puVar6 = 0;
  }
  pIVar9 = instr->m_prev;
  helperRet = IR::RegOpnd::New(TyInt8,instr->m_func);
  if ((instr->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x25ec,"(instr->HasBailOutInfo())","Expected bailOut on MemOp instruction");
    if (!bVar3) goto LAB_005ac70b;
    *puVar6 = 0;
    if ((instr->field_0x38 & 0x10) != 0) goto LAB_005ac3aa;
  }
  else {
LAB_005ac3aa:
    BVar4 = IR::Instr::GetBailOutKind(instr);
    if ((BVar4 >> 0x12 & 1) == 0) {
      if ((BVar4 >> 0xe & 1) != 0) {
        LowerBailOnCreatedMissingValue(this,instr,false);
        BVar4 = BVar4 & ~(BailOutOnInvalidatedArrayHeadSegment|BailOutOnMissingValue);
        if (BVar4 == BailOutInvalid) goto LAB_005ac664;
        BVar5 = IR::Instr::GetBailOutKind(instr);
        if (BVar5 != BVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          uVar8 = 0x25fb;
          goto LAB_005ac4fc;
        }
      }
LAB_005ac511:
      if ((BVar4 >> 0x13 & 1) != 0) {
        LowerBailOnInvalidatedArrayLength(this,instr,false);
        BVar4 = BVar4 & ~(BailOutOnInvalidatedArrayLength|BailOutOnInvalidatedArrayHeadSegment);
        if (BVar4 == BailOutInvalid) goto LAB_005ac664;
        BVar5 = IR::Instr::GetBailOutKind(instr);
        if (BVar5 != BVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2601,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                             "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
          if (!bVar3) goto LAB_005ac70b;
          *puVar6 = 0;
        }
      }
      if ((BVar4 & BailOutOnMemOpError) == BailOutInvalid) goto LAB_005ac664;
      target = IR::Instr::GetOrCreateContinueLabel(instr,false);
      func = instr->m_func;
      LowerOneBailOutKind(this,instr,BailOutOnMemOpError,false,false);
      pIVar7 = instr->m_next;
      this_00 = (Lowerer *)0x0;
      compareSrc2 = IR::IntConstOpnd::New(0,TyInt8,func,false);
      InsertCompareBranch(this_00,&helperRet->super_Opnd,&compareSrc2->super_Opnd,BrNeq_A,false,
                          target,pIVar7,false);
      if (BVar4 != BailOutOnMemOpError) {
        BVar5 = IR::Instr::GetBailOutKind(instr);
        if ((BVar5 ^ BVar4) == BailOutOnMemOpError) goto LAB_005ac6b6;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        error = "(!bailOutKind || instr->GetBailOutKind() == bailOutKind)";
        message = "!bailOutKind || instr->GetBailOutKind() == bailOutKind";
        uVar8 = 0x261a;
        goto LAB_005ac6a5;
      }
    }
    else {
      if ((BVar4 >> 0xe & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x25f2,"(!(bailOutKind & IR::BailOutOnMissingValue))",
                           "!(bailOutKind & IR::BailOutOnMissingValue)");
        if (!bVar3) goto LAB_005ac70b;
        *puVar6 = 0;
      }
      LowerBailOnInvalidatedArrayHeadSegment(this,instr,false);
      BVar4 = BVar4 & ~BailOutOnInvalidatedArrayHeadSegment;
      if (BVar4 != BailOutInvalid) {
        BVar5 = IR::Instr::GetBailOutKind(instr);
        if (BVar5 != BVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          uVar8 = 0x25f5;
LAB_005ac4fc:
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,uVar8,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                             "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
          if (!bVar3) goto LAB_005ac70b;
          *puVar6 = 0;
        }
        goto LAB_005ac511;
      }
LAB_005ac664:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      error = "(bailOutKind & IR::BailOutOnMemOpError)";
      message = "Expected BailOutOnMemOpError on MemOp instruction";
      uVar8 = 0x2604;
LAB_005ac6a5:
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,uVar8,error,message);
      if (!bVar3) {
LAB_005ac70b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
LAB_005ac6b6:
    IR::Instr::ClearBailOutInfo(instr);
  }
  if (instr->m_opcode == Memcopy) {
    LowerMemcopy(this,instr,helperRet);
  }
  else if (instr->m_opcode == Memset) {
    pIVar7 = LowerMemset(this,instr,helperRet);
    goto LAB_005ac6f2;
  }
  pIVar7 = (Instr *)0x0;
LAB_005ac6f2:
  if (pIVar7 != (Instr *)0x0) {
    pIVar9 = pIVar7;
  }
  return pIVar9;
}

Assistant:

IR::Instr *
Lowerer::LowerMemOp(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    IR::Instr *instrPrev = instr->m_prev;

    IR::RegOpnd* helperRet = IR::RegOpnd::New(TyInt8, instr->m_func);
    const bool isHelper = false;
    AssertMsg(instr->HasBailOutInfo(), "Expected bailOut on MemOp instruction");
    if (instr->HasBailOutInfo())
    {
        IR::BailOutKind bailOutKind = instr->GetBailOutKind();
        if (bailOutKind & IR::BailOutOnInvalidatedArrayHeadSegment)
        {
            Assert(!(bailOutKind & IR::BailOutOnMissingValue));
            LowerBailOnInvalidatedArrayHeadSegment(instr, isHelper);
            bailOutKind ^= IR::BailOutOnInvalidatedArrayHeadSegment;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        else if (bailOutKind & IR::BailOutOnMissingValue)
        {
            LowerBailOnCreatedMissingValue(instr, isHelper);
            bailOutKind ^= IR::BailOutOnMissingValue;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        if (bailOutKind & IR::BailOutOnInvalidatedArrayLength)
        {
            LowerBailOnInvalidatedArrayLength(instr, isHelper);
            bailOutKind ^= IR::BailOutOnInvalidatedArrayLength;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }

        AssertMsg(bailOutKind & IR::BailOutOnMemOpError, "Expected BailOutOnMemOpError on MemOp instruction");
        if (bailOutKind & IR::BailOutOnMemOpError)
        {
            // Insert or get continue label
            IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isHelper);
            Func *const func = instr->m_func;
            LowerOneBailOutKind(instr, IR::BailOutOnMemOpError, isHelper);
            IR::Instr *const insertBeforeInstr = instr->m_next;

            //     test helperRet, helperRet
            //     jz $skipBailOut
            InsertCompareBranch(
                helperRet,
                IR::IntConstOpnd::New(0, TyInt8, func),
                Js::OpCode::BrNeq_A,
                skipBailOutLabel,
                insertBeforeInstr);

            //     (Bail out with IR::BailOutOnMemOpError)
            //     $skipBailOut:

            bailOutKind ^= IR::BailOutOnMemOpError;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }

        instr->ClearBailOutInfo();
    }

    IR::Instr* newInstrPrev = nullptr;
    if (instr->m_opcode == Js::OpCode::Memset)
    {
        newInstrPrev = LowerMemset(instr, helperRet);
    }
    else if (instr->m_opcode == Js::OpCode::Memcopy)
    {
        newInstrPrev = LowerMemcopy(instr, helperRet);
    }

    if (newInstrPrev != nullptr)
    {
        instrPrev = newInstrPrev;
    }
    return instrPrev;
}